

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigurationValue.cpp
# Opt level: O0

unsigned_short
Corrade::Utility::Implementation::IntegerConfigurationValue<unsigned_short>::fromString
          (string *stringValue,ConfigurationValueFlags flags)

{
  bool bVar1;
  ulong uVar2;
  unsigned_short local_1b2;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_1b0;
  EnumSet local_1af;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_1ae;
  EnumSet local_1ad [3];
  unsigned_short value;
  EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_> local_19a;
  EnumSet local_199;
  long local_198;
  istringstream stream;
  string *stringValue_local;
  ConfigurationValueFlags flags_local;
  
  stringValue_local._5_1_ = flags._value;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)&local_198,stringValue,8);
    Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_19a,Hex);
    local_199 = (EnumSet)Containers::
                         EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                         operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                    *)((long)&stringValue_local + 5),local_19a);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_199);
    if (bVar1) {
      std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),_S_hex,
                          _S_basefield);
    }
    else {
      Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
                (&local_1ae,Oct);
      local_1ad[0] = (EnumSet)Containers::
                              EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>
                              ::operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                           *)((long)&stringValue_local + 5),local_1ae);
      bVar1 = Containers::EnumSet::operator_cast_to_bool(local_1ad);
      if (bVar1) {
        std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),_S_oct,
                            _S_basefield);
      }
    }
    Containers::EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::EnumSet
              (&local_1b0,Uppercase);
    local_1af = (EnumSet)Containers::
                         EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)'\xff'>::
                         operator&((EnumSet<Corrade::Utility::ConfigurationValueFlag,_(unsigned_char)__xff_>
                                    *)((long)&stringValue_local + 5),local_1b0);
    bVar1 = Containers::EnumSet::operator_cast_to_bool(&local_1af);
    if (bVar1) {
      std::ios_base::setf((ios_base *)((long)&local_198 + *(long *)(local_198 + -0x18)),_S_uppercase
                         );
    }
    std::istream::operator>>(&local_198,&local_1b2);
    stringValue_local._6_2_ = local_1b2;
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_198);
  }
  else {
    stringValue_local._6_2_ = 0;
  }
  return stringValue_local._6_2_;
}

Assistant:

T IntegerConfigurationValue<T>::fromString(const std::string& stringValue, ConfigurationValueFlags flags) {
        if(stringValue.empty()) return T{};

        std::istringstream stream{stringValue};

        /* Hexadecimal / octal values */
        if(flags & ConfigurationValueFlag::Hex)
            stream.setf(std::istringstream::hex, std::istringstream::basefield);
        else if(flags & ConfigurationValueFlag::Oct)
            stream.setf(std::istringstream::oct, std::istringstream::basefield);

        if(flags & ConfigurationValueFlag::Uppercase)
            stream.setf(std::istringstream::uppercase);

        T value;
        stream >> value;
        return value;
    }